

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mem.cpp
# Opt level: O0

void * crnlib::crnlib_realloc(void *p,size_t size,size_t *pActual_size,bool movable)

{
  byte in_CL;
  ulong *in_RDX;
  ulong in_RSI;
  ulong in_RDI;
  void *p_new;
  size_t actual_size;
  ulong local_30;
  byte local_21;
  ulong *local_20;
  ulong local_18;
  void *local_8;
  
  local_21 = in_CL & 1;
  if ((in_RDI & 0xf) == 0) {
    if (in_RSI < 0x400000001) {
      local_18 = in_RSI;
      if ((in_RSI != 0) && (in_RSI < 4)) {
        local_18 = 4;
      }
      local_30 = local_18;
      local_20 = in_RDX;
      local_8 = (void *)(*(code *)g_pRealloc)(in_RDI,local_18,&local_30,local_21,g_pUser_data);
      if (local_20 != (ulong *)0x0) {
        *local_20 = local_30;
      }
    }
    else {
      crnlib_mem_error((char *)0x1525a1);
      local_8 = (void *)0x0;
    }
  }
  else {
    crnlib_mem_error((char *)0x152576);
    local_8 = (void *)0x0;
  }
  return local_8;
}

Assistant:

void* crnlib_realloc(void* p, size_t size, size_t* pActual_size, bool movable) {
  if ((ptr_bits_t)p & (CRNLIB_MIN_ALLOC_ALIGNMENT - 1)) {
    crnlib_mem_error("crnlib_realloc: bad ptr");
    return NULL;
  }

  if (size > CRNLIB_MAX_POSSIBLE_BLOCK_SIZE) {
    crnlib_mem_error("crnlib_malloc: size too big");
    return NULL;
  }

#if CRNLIB_MEM_STATS
  size_t cur_size = p ? (*g_pMSize)(p, g_pUser_data) : 0;
  CRNLIB_ASSERT(!p || (cur_size >= sizeof(uint32)));
#endif
  if ((size) && (size < sizeof(uint32)))
    size = sizeof(uint32);

  size_t actual_size = size;
  void* p_new = (*g_pRealloc)(p, size, &actual_size, movable, g_pUser_data);

  if (pActual_size)
    *pActual_size = actual_size;

  CRNLIB_ASSERT((reinterpret_cast<ptr_bits_t>(p_new) & (CRNLIB_MIN_ALLOC_ALIGNMENT - 1)) == 0);

#if CRNLIB_MEM_STATS
  CRNLIB_ASSERT(!p_new || ((*g_pMSize)(p_new, g_pUser_data) == actual_size));

  int num_new_blocks = 0;
  if (p) {
    if (!p_new)
      num_new_blocks = -1;
  } else if (p_new) {
    num_new_blocks = 1;
  }
  update_total_allocated(num_new_blocks, static_cast<mem_stat_t>(actual_size) - static_cast<mem_stat_t>(cur_size));
#endif

  return p_new;
}